

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxin.cpp
# Opt level: O2

void __thiscall
ConfidentialTxIn_Constractor3_Test::TestBody(ConfidentialTxIn_Constractor3_Test *this)

{
  char *pcVar1;
  Txid local_1d8;
  AssertionResult gtest_ar;
  string local_198;
  AssertionResult gtest_ar_2;
  ConfidentialTxIn txin1;
  
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&txin1,&exp_txid,2);
  local_1d8._vptr_Txid._0_4_ = cfd::core::AbstractTxIn::GetVout(&txin1.super_AbstractTxIn);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"txin1.GetVout()","exp_index",(uint *)&local_1d8,&exp_index);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1d8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x84,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_198,(Message *)&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_198);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_1d8._vptr_Txid._0_4_ = cfd::core::AbstractTxIn::GetSequence(&txin1.super_AbstractTxIn);
  local_198._M_dataplus._M_p._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"txin1.GetSequence()","0",(uint *)&local_1d8,(int *)&local_198);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1d8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x85,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_198,(Message *)&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_198);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::AbstractTxIn::GetTxid(&local_1d8,&txin1.super_AbstractTxIn);
  cfd::core::Txid::GetHex_abi_cxx11_((string *)&gtest_ar,&local_1d8);
  cfd::core::Txid::GetHex_abi_cxx11_(&local_198,&exp_txid);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin1.GetTxid().GetHex().c_str()","exp_txid.GetHex().c_str()",
             (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),
             (char *)CONCAT44(local_198._M_dataplus._M_p._4_4_,local_198._M_dataplus._M_p._0_4_));
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&gtest_ar);
  cfd::core::Txid::~Txid(&local_1d8);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x86,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  cfd::core::ConfidentialTxIn::~ConfidentialTxIn(&txin1);
  return;
}

Assistant:

TEST(ConfidentialTxIn, Constractor3) {
  ConfidentialTxIn txin1(exp_txid, exp_index);
  EXPECT_EQ(txin1.GetVout(), exp_index);
  EXPECT_EQ(txin1.GetSequence(), 0);
  EXPECT_STREQ(txin1.GetTxid().GetHex().c_str(), exp_txid.GetHex().c_str());
}